

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O2

float rnd_well_nextf(rnd_well_t *well)

{
  uint uVar1;
  
  uVar1 = rnd_well_next(well);
  return (float)(uVar1 >> 9 | 0x3f800000) + -1.0;
}

Assistant:

float rnd_well_nextf( rnd_well_t* well )
    {
    return rnd_internal_float_normalized_from_u32( rnd_well_next( well ) );
    }